

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void replaceFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uchar *puVar5;
  uchar *__s2;
  uchar *__src;
  sqlite3 *psVar6;
  char *pcVar7;
  sqlite3 *db;
  u8 *zOld;
  int local_60;
  int j;
  int i;
  int loopLimit;
  i64 nOut;
  int nRep;
  int nPattern;
  int nStr;
  uchar *zOut;
  uchar *zRep;
  uchar *zPattern;
  uchar *zStr;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  puVar5 = sqlite3_value_text(*argv);
  if (puVar5 != (uchar *)0x0) {
    iVar1 = sqlite3_value_bytes(*argv);
    __s2 = sqlite3_value_text(argv[1]);
    if (__s2 != (uchar *)0x0) {
      if (*__s2 == '\0') {
        sqlite3_result_value(context,*argv);
      }
      else {
        iVar2 = sqlite3_value_bytes(argv[1]);
        __src = sqlite3_value_text(argv[2]);
        if (__src != (uchar *)0x0) {
          iVar3 = sqlite3_value_bytes(argv[2]);
          _i = (long)(iVar1 + 1);
          _nPattern = (char *)contextMalloc(context,_i);
          if (_nPattern != (char *)0x0) {
            zOld._4_4_ = 0;
            for (local_60 = 0; local_60 <= iVar1 - iVar2; local_60 = local_60 + 1) {
              if ((puVar5[local_60] == *__s2) &&
                 (iVar4 = memcmp(puVar5 + local_60,__s2,(long)iVar2), iVar4 == 0)) {
                psVar6 = sqlite3_context_db_handle(context);
                _i = (iVar3 - iVar2) + _i;
                if ((long)psVar6->aLimit[0] < _i + -1) {
                  sqlite3_result_error_toobig(context);
                  sqlite3_free(_nPattern);
                  return;
                }
                pcVar7 = (char *)sqlite3_realloc(_nPattern,(int)_i);
                if (pcVar7 == (char *)0x0) {
                  sqlite3_result_error_nomem(context);
                  sqlite3_free(_nPattern);
                  return;
                }
                memcpy(pcVar7 + zOld._4_4_,__src,(long)iVar3);
                zOld._4_4_ = iVar3 + zOld._4_4_;
                local_60 = iVar2 + -1 + local_60;
                _nPattern = pcVar7;
              }
              else {
                _nPattern[zOld._4_4_] = puVar5[local_60];
                zOld._4_4_ = zOld._4_4_ + 1;
              }
            }
            memcpy(_nPattern + zOld._4_4_,puVar5 + local_60,(long)(iVar1 - local_60));
            iVar1 = (iVar1 - local_60) + zOld._4_4_;
            _nPattern[iVar1] = '\0';
            sqlite3_result_text(context,_nPattern,iVar1,sqlite3_free);
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void replaceFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *zStr;        /* The input string A */
  const unsigned char *zPattern;    /* The pattern string B */
  const unsigned char *zRep;        /* The replacement string C */
  unsigned char *zOut;              /* The output */
  int nStr;                /* Size of zStr */
  int nPattern;            /* Size of zPattern */
  int nRep;                /* Size of zRep */
  i64 nOut;                /* Maximum size of zOut */
  int loopLimit;           /* Last zStr[] that might match zPattern[] */
  int i, j;                /* Loop counters */

  assert( argc==3 );
  UNUSED_PARAMETER(argc);
  zStr = sqlite3_value_text(argv[0]);
  if( zStr==0 ) return;
  nStr = sqlite3_value_bytes(argv[0]);
  assert( zStr==sqlite3_value_text(argv[0]) );  /* No encoding change */
  zPattern = sqlite3_value_text(argv[1]);
  if( zPattern==0 ){
    assert( sqlite3_value_type(argv[1])==SQLITE_NULL
            || sqlite3_context_db_handle(context)->mallocFailed );
    return;
  }
  if( zPattern[0]==0 ){
    assert( sqlite3_value_type(argv[1])!=SQLITE_NULL );
    sqlite3_result_value(context, argv[0]);
    return;
  }
  nPattern = sqlite3_value_bytes(argv[1]);
  assert( zPattern==sqlite3_value_text(argv[1]) );  /* No encoding change */
  zRep = sqlite3_value_text(argv[2]);
  if( zRep==0 ) return;
  nRep = sqlite3_value_bytes(argv[2]);
  assert( zRep==sqlite3_value_text(argv[2]) );
  nOut = nStr + 1;
  assert( nOut<SQLITE_MAX_LENGTH );
  zOut = contextMalloc(context, (i64)nOut);
  if( zOut==0 ){
    return;
  }
  loopLimit = nStr - nPattern;  
  for(i=j=0; i<=loopLimit; i++){
    if( zStr[i]!=zPattern[0] || memcmp(&zStr[i], zPattern, nPattern) ){
      zOut[j++] = zStr[i];
    }else{
      u8 *zOld;
      sqlite3 *db = sqlite3_context_db_handle(context);
      nOut += nRep - nPattern;
      testcase( nOut-1==db->aLimit[SQLITE_LIMIT_LENGTH] );
      testcase( nOut-2==db->aLimit[SQLITE_LIMIT_LENGTH] );
      if( nOut-1>db->aLimit[SQLITE_LIMIT_LENGTH] ){
        sqlite3_result_error_toobig(context);
        sqlite3_free(zOut);
        return;
      }
      zOld = zOut;
      zOut = sqlite3_realloc(zOut, (int)nOut);
      if( zOut==0 ){
        sqlite3_result_error_nomem(context);
        sqlite3_free(zOld);
        return;
      }
      memcpy(&zOut[j], zRep, nRep);
      j += nRep;
      i += nPattern-1;
    }
  }
  assert( j+nStr-i+1==nOut );
  memcpy(&zOut[j], &zStr[i], nStr-i);
  j += nStr - i;
  assert( j<=nOut );
  zOut[j] = 0;
  sqlite3_result_text(context, (char*)zOut, j, sqlite3_free);
}